

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  double *pdVar1;
  double *pdVar2;
  BaseType_conflict3 threshold;
  double dVar3;
  double dVar4;
  uint __line;
  double (*padVar5) [3];
  uint i;
  long lVar6;
  uint j;
  long lVar7;
  char *__assertion;
  TV S;
  Matrix33<double> MS;
  Matrix33<double> V;
  Matrix33<double> local_140;
  Matrix33<double> local_f8;
  Matrix33<double> MA;
  Matrix33<double> AA;
  
  threshold = computeThreshold<Imath_3_2::Matrix33<double>>(A);
  Imath_3_2::Matrix33<double>::Matrix33(&AA,A);
  V.x[0][0] = 1.0;
  V.x[1][0] = 0.0;
  V.x[0][1] = 0.0;
  V.x[0][2] = 0.0;
  V.x[1][1] = 1.0;
  V.x[1][2] = 0.0;
  V.x[2][0] = 0.0;
  V.x[2][1] = 0.0;
  V.x[2][2] = 1.0;
  Imath_3_2::jacobiEigenSolver<double>(&AA,&S,&V);
  verifyOrthonormal<Imath_3_2::Matrix33<double>>(&V,threshold);
  dVar3 = Imath_3_2::Matrix33<double>::determinant(&V);
  if (threshold <= ABS(dVar3) + -1.0) {
    __assertion = "abs (V.determinant ()) - 1 < threshold";
    __line = 0x67;
  }
  else {
    padVar5 = (double (*) [3])&MS;
    MS.x[0][0] = 1.0;
    MS.x[0][1] = 0.0;
    MS.x[0][2] = 0.0;
    MS.x[1][0] = 0.0;
    MS.x[1][1] = 1.0;
    MS.x[2][1] = 0.0;
    MS.x[1][2] = 0.0;
    MS.x[2][0] = 0.0;
    MS.x[2][2] = 1.0;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        if (lVar6 == lVar7) {
          *(undefined8 *)((long)MS.x + lVar6 * 0x20) =
               *(undefined8 *)((long)(MS.x + -1) + lVar6 * 8);
        }
        else {
          (*(double (*) [3])*padVar5)[lVar7] = 0.0;
        }
      }
      padVar5 = padVar5 + 1;
    }
    dVar3 = Imath_3_2::Matrix33<double>::determinant(A);
    dVar4 = Imath_3_2::Matrix33<double>::determinant(&MS);
    if (ABS(dVar3) - ABS(dVar4) < threshold) {
      Imath_3_2::Matrix33<double>::operator*(&V,&MS);
      local_140.x[0][0] = V.x[0][0];
      local_140.x[0][1] = V.x[1][0];
      local_140.x[0][2] = V.x[2][0];
      local_140.x[1][0] = V.x[0][1];
      local_140.x[1][1] = V.x[1][1];
      local_140.x[1][2] = V.x[2][1];
      local_140.x[2][0] = V.x[0][2];
      local_140.x[2][1] = V.x[1][2];
      local_140.x[2][2] = V.x[2][2];
      padVar5 = (double (*) [3])&MA;
      Imath_3_2::Matrix33<double>::operator*(&local_f8,&local_140);
      lVar6 = 0;
      do {
        if (lVar6 == 3) {
          return;
        }
        lVar7 = 0;
        while (lVar7 != 3) {
          pdVar1 = *(double (*) [3])*(double (*) [3])A + lVar7;
          pdVar2 = *(double (*) [3])*padVar5 + lVar7;
          lVar7 = lVar7 + 1;
          if (threshold <= ABS(*pdVar1 - *pdVar2)) {
            __assertion = "abs (A[i][j] - MA[i][j]) < threshold";
            __line = 0x79;
            goto LAB_0012f308;
          }
        }
        lVar6 = lVar6 + 1;
        A = (Matrix33<double> *)((long)A + 0x18);
        padVar5 = padVar5 + 1;
      } while( true );
    }
    __assertion = "abs (A.determinant ()) - abs (MS.determinant ()) < threshold";
    __line = 0x72;
  }
LAB_0012f308:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,__line,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<double>]")
  ;
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}